

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::InstanceArrayIntersectorKMB<4>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined8 uVar7;
  ulong uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  AABBNodeMB4D *node1;
  long lVar14;
  size_t sVar15;
  byte bVar16;
  uint uVar17;
  size_t sVar18;
  Primitive_conflict4 *prim;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar19;
  NodeRef *pNVar20;
  byte bVar21;
  byte bVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar41;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar42;
  vint4 ai_2;
  undefined1 in_ZMM2 [64];
  vint4 ai;
  undefined1 auVar43 [16];
  vint4 ai_1;
  undefined1 auVar44 [16];
  vint4 ai_3;
  undefined1 auVar45 [16];
  vint4 bi;
  undefined1 auVar46 [16];
  vint4 bi_1;
  undefined1 auVar47 [16];
  vint4 bi_3;
  undefined1 auVar48 [16];
  vint4 bi_2;
  undefined1 auVar49 [64];
  vint4 bi_10;
  undefined1 auVar50 [64];
  vbool<4>_conflict valid0;
  InstanceArrayIntersectorKMB<4> local_357a;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar28;
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    auVar27 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar29 = ZEXT816(0) << 0x40;
    uVar7 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar29,5);
    uVar23 = vpcmpeqd_avx512vl(auVar27,(undefined1  [16])valid_i->field_0);
    uVar23 = ((byte)uVar7 & 0xf) & uVar23;
    bVar21 = (byte)uVar23;
    if (bVar21 != 0) {
      auVar27 = *(undefined1 (*) [16])(ray + 0x40);
      auVar2 = *(undefined1 (*) [16])(ray + 0x50);
      auVar30 = *(undefined1 (*) [16])(ray + 0x60);
      auVar24._8_4_ = 0x7fffffff;
      auVar24._0_8_ = 0x7fffffff7fffffff;
      auVar24._12_4_ = 0x7fffffff;
      auVar31 = vandps_avx(auVar27,auVar24);
      auVar25._8_4_ = 0x219392ef;
      auVar25._0_8_ = 0x219392ef219392ef;
      auVar25._12_4_ = 0x219392ef;
      uVar8 = vcmpps_avx512vl(auVar31,auVar25,1);
      bVar4 = (bool)((byte)uVar8 & 1);
      auVar31._0_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar27._0_4_;
      bVar4 = (bool)((byte)(uVar8 >> 1) & 1);
      auVar31._4_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar27._4_4_;
      bVar4 = (bool)((byte)(uVar8 >> 2) & 1);
      auVar31._8_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar27._8_4_;
      bVar4 = (bool)((byte)(uVar8 >> 3) & 1);
      auVar31._12_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar27._12_4_;
      auVar27 = vandps_avx(auVar2,auVar24);
      uVar8 = vcmpps_avx512vl(auVar27,auVar25,1);
      bVar4 = (bool)((byte)uVar8 & 1);
      auVar26._0_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar2._0_4_;
      bVar4 = (bool)((byte)(uVar8 >> 1) & 1);
      auVar26._4_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar2._4_4_;
      bVar4 = (bool)((byte)(uVar8 >> 2) & 1);
      auVar26._8_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar2._8_4_;
      bVar4 = (bool)((byte)(uVar8 >> 3) & 1);
      auVar26._12_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar2._12_4_;
      auVar27 = vandps_avx(auVar30,auVar24);
      uVar8 = vcmpps_avx512vl(auVar27,auVar25,1);
      bVar4 = (bool)((byte)uVar8 & 1);
      auVar27._0_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar30._0_4_;
      bVar4 = (bool)((byte)(uVar8 >> 1) & 1);
      auVar27._4_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar30._4_4_;
      bVar4 = (bool)((byte)(uVar8 >> 2) & 1);
      auVar27._8_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar30._8_4_;
      bVar4 = (bool)((byte)(uVar8 >> 3) & 1);
      auVar27._12_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar30._12_4_;
      auVar33._8_4_ = 0x3f800000;
      auVar33._0_8_ = 0x3f8000003f800000;
      auVar33._12_4_ = 0x3f800000;
      auVar24 = vrcp14ps_avx512vl(auVar31);
      auVar2 = vfnmadd213ps_fma(auVar31,auVar24,auVar33);
      auVar25 = vrcp14ps_avx512vl(auVar26);
      auVar30 = vfnmadd213ps_fma(auVar26,auVar25,auVar33);
      auVar26 = vrcp14ps_avx512vl(auVar27);
      auVar31 = vfnmadd213ps_fma(auVar27,auVar26,auVar33);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar49 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar27 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar29);
      aVar28._0_4_ = (uint)(bVar21 & 1) * auVar27._0_4_ | (uint)!(bool)(bVar21 & 1) * 0x7f800000;
      bVar4 = (bool)((byte)(uVar23 >> 1) & 1);
      aVar28._4_4_ = (uint)bVar4 * auVar27._4_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = (bool)((byte)(uVar23 >> 2) & 1);
      aVar28._8_4_ = (uint)bVar4 * auVar27._8_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = SUB81(uVar23 >> 3,0);
      aVar28._12_4_ = (uint)bVar4 * auVar27._12_4_ | (uint)!bVar4 * 0x7f800000;
      auVar27 = *(undefined1 (*) [16])ray;
      auVar34._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
      auVar34._8_4_ = auVar27._8_4_ ^ 0x80000000;
      auVar34._12_4_ = auVar27._12_4_ ^ 0x80000000;
      auVar27 = *(undefined1 (*) [16])(ray + 0x10);
      auVar35._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
      auVar35._8_4_ = auVar27._8_4_ ^ 0x80000000;
      auVar35._12_4_ = auVar27._12_4_ ^ 0x80000000;
      auVar27 = *(undefined1 (*) [16])(ray + 0x20);
      auVar32._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
      auVar32._8_4_ = auVar27._8_4_ ^ 0x80000000;
      auVar32._12_4_ = auVar27._12_4_ ^ 0x80000000;
      auVar27 = vfmadd132ps_fma(auVar30,auVar25,auVar25);
      auVar29 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar29);
      bVar4 = (bool)((byte)(uVar23 >> 1) & 1);
      bVar5 = (bool)((byte)(uVar23 >> 2) & 1);
      bVar6 = SUB81(uVar23 >> 3,0);
      auVar50 = ZEXT1664(CONCAT412((uint)bVar6 * auVar29._12_4_ | (uint)!bVar6 * -0x800000,
                                   CONCAT48((uint)bVar5 * auVar29._8_4_ | (uint)!bVar5 * -0x800000,
                                            CONCAT44((uint)bVar4 * auVar29._4_4_ |
                                                     (uint)!bVar4 * -0x800000,
                                                     (uint)(bVar21 & 1) * auVar29._0_4_ |
                                                     (uint)!(bool)(bVar21 & 1) * -0x800000))));
      auVar29 = vfmadd132ps_fma(auVar2,auVar24,auVar24);
      auVar2 = vfmadd132ps_fma(auVar31,auVar26,auVar26);
      bVar16 = (byte)((ushort)((short)uVar23 << 0xc) >> 0xc) ^ 0xf;
      pNVar20 = stack_node + 2;
      paVar19 = &stack_near[2].field_0;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[1].field_0 = aVar28;
      auVar30 = vmulps_avx512vl(auVar29,auVar34);
      auVar31 = vmulps_avx512vl(auVar27,auVar35);
      auVar26 = vmulps_avx512vl(auVar2,auVar32);
LAB_01d8731d:
      sVar18 = pNVar20[-1].ptr;
      if (sVar18 != 0xfffffffffffffff8) {
        pNVar20 = pNVar20 + -1;
        aVar42 = paVar19[-1];
        paVar19 = paVar19 + -1;
        auVar24 = auVar50._0_16_;
        uVar7 = vcmpps_avx512vl((undefined1  [16])aVar42,auVar24,1);
        if ((char)uVar7 != '\0') {
          do {
            uVar7 = vcmpps_avx512vl(auVar24,(undefined1  [16])aVar42,6);
            uVar17 = (uint)sVar18;
            if ((sVar18 & 8) != 0) {
              if (sVar18 == 0xfffffffffffffff8) goto LAB_01d875c1;
              if ((byte)uVar7 != 0) {
                valid0.v = ~bVar16 & 0xf;
                lVar14 = (ulong)(uVar17 & 0xf) - 7;
                prim = (Primitive_conflict4 *)(sVar18 & 0xfffffffffffffff0);
                goto LAB_01d87509;
              }
              break;
            }
            uVar23 = sVar18 & 0xfffffffffffffff0;
            sVar18 = 8;
            aVar42 = auVar49._0_16_;
            for (lVar14 = -0x20;
                (lVar14 != 0 && (sVar3 = *(size_t *)(uVar23 + 0x40 + lVar14 * 2), sVar3 != 8));
                lVar14 = lVar14 + 4) {
              uVar1 = *(undefined4 *)(uVar23 + 0x120 + lVar14);
              auVar43._4_4_ = uVar1;
              auVar43._0_4_ = uVar1;
              auVar43._8_4_ = uVar1;
              auVar43._12_4_ = uVar1;
              auVar25 = *(undefined1 (*) [16])(ray + 0x70);
              uVar1 = *(undefined4 *)(uVar23 + 0x60 + lVar14);
              auVar36._4_4_ = uVar1;
              auVar36._0_4_ = uVar1;
              auVar36._8_4_ = uVar1;
              auVar36._12_4_ = uVar1;
              auVar32 = vfmadd213ps_avx512vl(auVar43,auVar25,auVar36);
              uVar1 = *(undefined4 *)(uVar23 + 0x160 + lVar14);
              auVar44._4_4_ = uVar1;
              auVar44._0_4_ = uVar1;
              auVar44._8_4_ = uVar1;
              auVar44._12_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar23 + 0xa0 + lVar14);
              auVar37._4_4_ = uVar1;
              auVar37._0_4_ = uVar1;
              auVar37._8_4_ = uVar1;
              auVar37._12_4_ = uVar1;
              auVar33 = vfmadd213ps_avx512vl(auVar44,auVar25,auVar37);
              uVar1 = *(undefined4 *)(uVar23 + 0x1a0 + lVar14);
              auVar45._4_4_ = uVar1;
              auVar45._0_4_ = uVar1;
              auVar45._8_4_ = uVar1;
              auVar45._12_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar23 + 0xe0 + lVar14);
              auVar38._4_4_ = uVar1;
              auVar38._0_4_ = uVar1;
              auVar38._8_4_ = uVar1;
              auVar38._12_4_ = uVar1;
              auVar34 = vfmadd213ps_avx512vl(auVar45,auVar25,auVar38);
              uVar1 = *(undefined4 *)(uVar23 + 0x140 + lVar14);
              auVar46._4_4_ = uVar1;
              auVar46._0_4_ = uVar1;
              auVar46._8_4_ = uVar1;
              auVar46._12_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar23 + 0x80 + lVar14);
              auVar39._4_4_ = uVar1;
              auVar39._0_4_ = uVar1;
              auVar39._8_4_ = uVar1;
              auVar39._12_4_ = uVar1;
              auVar35 = vfmadd213ps_avx512vl(auVar46,auVar25,auVar39);
              uVar1 = *(undefined4 *)(uVar23 + 0x180 + lVar14);
              auVar47._4_4_ = uVar1;
              auVar47._0_4_ = uVar1;
              auVar47._8_4_ = uVar1;
              auVar47._12_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar23 + 0xc0 + lVar14);
              auVar40._4_4_ = uVar1;
              auVar40._0_4_ = uVar1;
              auVar40._8_4_ = uVar1;
              auVar40._12_4_ = uVar1;
              auVar36 = vfmadd213ps_avx512vl(auVar47,auVar25,auVar40);
              uVar1 = *(undefined4 *)(uVar23 + 0x1c0 + lVar14);
              auVar48._4_4_ = uVar1;
              auVar48._0_4_ = uVar1;
              auVar48._8_4_ = uVar1;
              auVar48._12_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar23 + 0x100 + lVar14);
              auVar11._4_4_ = uVar1;
              auVar11._0_4_ = uVar1;
              auVar11._8_4_ = uVar1;
              auVar11._12_4_ = uVar1;
              auVar37 = vfmadd213ps_avx512vl(auVar48,auVar25,auVar11);
              auVar38 = vfmadd213ps_avx512vl(auVar32,auVar29,auVar30);
              auVar39 = vfmadd213ps_avx512vl(auVar33,auVar27,auVar31);
              auVar40 = vfmadd213ps_avx512vl(auVar34,auVar2,auVar26);
              auVar34 = vfmadd213ps_avx512vl(auVar35,auVar29,auVar30);
              auVar35 = vfmadd213ps_avx512vl(auVar36,auVar27,auVar31);
              auVar36 = vfmadd213ps_avx512vl(auVar37,auVar2,auVar26);
              auVar32 = vpminsd_avx(auVar38,auVar34);
              auVar33 = vpminsd_avx(auVar39,auVar35);
              auVar32 = vpmaxsd_avx(auVar32,auVar33);
              auVar33 = vpminsd_avx(auVar40,auVar36);
              auVar32 = vpmaxsd_avx(auVar32,auVar33);
              auVar33 = vpmaxsd_avx(auVar38,auVar34);
              auVar34 = vpmaxsd_avx(auVar39,auVar35);
              auVar35 = vpminsd_avx(auVar33,auVar34);
              auVar33 = vpmaxsd_avx(auVar40,auVar36);
              auVar34 = vpmaxsd_avx(auVar32,(undefined1  [16])aVar28);
              auVar33 = vpminsd_avx(auVar33,auVar24);
              auVar33 = vpminsd_avx(auVar35,auVar33);
              uVar9 = vcmpps_avx512vl(auVar34,auVar33,2);
              bVar22 = (byte)uVar9;
              if ((uVar17 & 7) == 6) {
                uVar1 = *(undefined4 *)(uVar23 + 0x200 + lVar14);
                auVar12._4_4_ = uVar1;
                auVar12._0_4_ = uVar1;
                auVar12._8_4_ = uVar1;
                auVar12._12_4_ = uVar1;
                uVar9 = vcmpps_avx512vl(auVar25,auVar12,1);
                uVar1 = *(undefined4 *)(uVar23 + 0x1e0 + lVar14);
                auVar13._4_4_ = uVar1;
                auVar13._0_4_ = uVar1;
                auVar13._8_4_ = uVar1;
                auVar13._12_4_ = uVar1;
                uVar10 = vcmpps_avx512vl(auVar25,auVar13,0xd);
                bVar22 = (byte)uVar9 & (byte)uVar10 & bVar22;
              }
              bVar22 = bVar22 & (byte)uVar7;
              sVar15 = sVar18;
              aVar41 = aVar42;
              if (bVar22 != 0) {
                auVar32 = vblendmps_avx512vl((undefined1  [16])auVar49._0_16_,auVar32);
                aVar41._0_4_ = (uint)(bVar22 & 1) * auVar32._0_4_ |
                               (uint)!(bool)(bVar22 & 1) * auVar25._0_4_;
                bVar4 = (bool)(bVar22 >> 1 & 1);
                aVar41._4_4_ = (uint)bVar4 * auVar32._4_4_ | (uint)!bVar4 * auVar25._4_4_;
                bVar4 = (bool)(bVar22 >> 2 & 1);
                aVar41._8_4_ = (uint)bVar4 * auVar32._8_4_ | (uint)!bVar4 * auVar25._8_4_;
                bVar4 = (bool)(bVar22 >> 3 & 1);
                aVar41._12_4_ = (uint)bVar4 * auVar32._12_4_ | (uint)!bVar4 * auVar25._12_4_;
                sVar15 = sVar3;
                if (sVar18 != 8) {
                  pNVar20->ptr = sVar18;
                  pNVar20 = pNVar20 + 1;
                  *paVar19 = aVar42;
                  paVar19 = paVar19 + 1;
                }
              }
              aVar42 = aVar41;
              sVar18 = sVar15;
            }
          } while (sVar18 != 8);
        }
        goto LAB_01d8731d;
      }
LAB_01d875c1:
      bVar16 = bVar16 & bVar21;
      bVar4 = (bool)(bVar16 >> 1 & 1);
      bVar5 = (bool)(bVar16 >> 2 & 1);
      *(uint *)(ray + 0x80) =
           (uint)(bVar16 & 1) * -0x800000 | (uint)!(bool)(bVar16 & 1) * *(int *)(ray + 0x80);
      *(uint *)(ray + 0x84) = (uint)bVar4 * -0x800000 | (uint)!bVar4 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)(bVar16 >> 3) * -0x800000 | (uint)!(bool)(bVar16 >> 3) * *(int *)(ray + 0x8c);
    }
  }
  return;
  while( true ) {
    InstanceArrayIntersectorKMB<4>::occluded(&local_357a,&valid0,&pre,ray,context,prim);
    auVar50 = ZEXT1664(auVar24);
    auVar49 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
    valid0.v = ~(byte)local_357a & valid0.v & 0xf;
    prim = prim + 1;
    if (valid0.v == 0) break;
LAB_01d87509:
    lVar14 = lVar14 + -1;
    auVar25 = auVar50._0_16_;
    if (lVar14 == 0) goto LAB_01d8759c;
  }
  valid0.v = 0;
  auVar25 = auVar24;
LAB_01d8759c:
  bVar16 = bVar16 | valid0.v ^ 0xf;
  if (bVar16 == 0xf) {
    bVar16 = 0xf;
    goto LAB_01d875c1;
  }
  auVar24 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  bVar4 = (bool)(bVar16 >> 1 & 1);
  bVar5 = (bool)(bVar16 >> 2 & 1);
  auVar50 = ZEXT1664(CONCAT412((uint)(bVar16 >> 3) * auVar24._12_4_ |
                               (uint)!(bool)(bVar16 >> 3) * auVar25._12_4_,
                               CONCAT48((uint)bVar5 * auVar24._8_4_ | (uint)!bVar5 * auVar25._8_4_,
                                        CONCAT44((uint)bVar4 * auVar24._4_4_ |
                                                 (uint)!bVar4 * auVar25._4_4_,
                                                 (uint)(bVar16 & 1) * auVar24._0_4_ |
                                                 (uint)!(bool)(bVar16 & 1) * auVar25._0_4_))));
  goto LAB_01d8731d;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }